

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O1

FoldingSetNodeIDRef __thiscall
llvm::FoldingSetNodeID::Intern(FoldingSetNodeID *this,BumpPtrAllocator *Allocator)

{
  uint uVar1;
  FoldingSetNodeIDRef FVar2;
  
  FVar2.Data = BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                         (Allocator,
                          (ulong)(this->Bits).super_SmallVectorImpl<unsigned_int>.
                                 super_SmallVectorTemplateBase<unsigned_int,_true>.
                                 super_SmallVectorTemplateCommon<unsigned_int,_void>.
                                 super_SmallVectorBase.Size << 2,4);
  uVar1 = (this->Bits).super_SmallVectorImpl<unsigned_int>.
          super_SmallVectorTemplateBase<unsigned_int,_true>.
          super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size;
  if ((ulong)uVar1 != 0) {
    memmove(FVar2.Data,
            (this->Bits).super_SmallVectorImpl<unsigned_int>.
            super_SmallVectorTemplateBase<unsigned_int,_true>.
            super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX,
            (ulong)uVar1 * 4);
  }
  FVar2.Size._0_4_ = uVar1;
  FVar2.Size._4_4_ = 0;
  return FVar2;
}

Assistant:

FoldingSetNodeIDRef
FoldingSetNodeID::Intern(BumpPtrAllocator &Allocator) const {
  unsigned *New = Allocator.Allocate<unsigned>(Bits.size());
  std::uninitialized_copy(Bits.begin(), Bits.end(), New);
  return FoldingSetNodeIDRef(New, Bits.size());
}